

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

ggml_backend_reg_t ggml_backend_load_best(char *name,bool silent,char *user_search_path)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  path *this;
  long lVar5;
  code *pcVar6;
  ggml_backend_reg_t extraout_RAX;
  char (*__source) [2];
  char **__source_00;
  pointer ppVar7;
  undefined7 in_register_00000031;
  int local_1f4;
  path best_path;
  path ext;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  search_paths;
  string base_path;
  char *user_search_path_local;
  vector<char,_std::allocator<char>_> path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  directory_iterator __end2;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_f8;
  path *local_e8;
  path file_extension;
  directory_iterator dir_it;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_98;
  path name_path;
  char *name_local;
  path file_prefix;
  
  user_search_path_local = (char *)CONCAT71(in_register_00000031,silent);
  name_local = name;
  std::filesystem::__cxx11::u8path<char_const*,std::filesystem::__cxx11::path,char>
            (&name_path,(__cxx11 *)&name_local,(char **)user_search_path);
  backend_filename_prefix_abi_cxx11_();
  std::operator+(&ext._M_pathname,&file_extension._M_pathname,&name_path._M_pathname);
  std::filesystem::__cxx11::u8path<char[2],std::filesystem::__cxx11::path,char>
            (&best_path,(__cxx11 *)0x10a344,__source);
  std::operator+(&base_path,&ext._M_pathname,&best_path._M_pathname);
  std::filesystem::__cxx11::path::path(&file_prefix,&base_path,auto_format);
  std::__cxx11::string::~string((string *)&base_path);
  std::filesystem::__cxx11::path::~path(&best_path);
  std::__cxx11::string::~string((string *)&ext);
  std::filesystem::__cxx11::path::~path(&file_extension);
  backend_filename_extension_abi_cxx11_();
  search_paths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  search_paths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  search_paths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (user_search_path_local == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&base_path,".",(allocator<char> *)&ext);
    std::vector<char,_std::allocator<char>_>::vector(&path,0x400,(allocator_type *)&ext);
    while( true ) {
      sVar4 = readlink("/proc/self/exe",
                       path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
      if (sVar4 == -1) break;
      if (sVar4 < (long)path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start) {
        ext._M_pathname._M_dataplus._M_p = (pointer)&ext._M_pathname.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ext,
                   path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar4);
        std::__cxx11::string::operator=((string *)&base_path,(string *)&ext);
        std::__cxx11::string::~string((string *)&ext);
        lVar5 = std::__cxx11::string::rfind((char)&base_path,0x2f);
        if (lVar5 != -1) {
          std::__cxx11::string::substr((ulong)&ext,(ulong)&base_path);
          std::__cxx11::string::operator=((string *)&base_path,(string *)&ext);
          std::__cxx11::string::~string((string *)&ext);
        }
        break;
      }
      std::vector<char,_std::allocator<char>_>::resize
                (&path,((long)path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) * 2);
    }
    std::operator+(&ext._M_pathname,&base_path,"/");
    std::filesystem::__cxx11::path::path(&best_path,&ext._M_pathname,auto_format);
    std::__cxx11::string::~string((string *)&ext);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&path.super__Vector_base<char,_std::allocator<char>_>);
    std::__cxx11::string::~string((string *)&base_path);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&search_paths,&best_path);
    std::filesystem::__cxx11::path::~path(&best_path);
    std::filesystem::current_path_abi_cxx11_();
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&search_paths,&best_path);
  }
  else {
    std::filesystem::__cxx11::u8path<char_const*,std::filesystem::__cxx11::path,char>
              (&best_path,(__cxx11 *)&user_search_path_local,__source_00);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&search_paths,&best_path);
  }
  std::filesystem::__cxx11::path::~path(&best_path);
  std::filesystem::__cxx11::path::path(&best_path);
  local_e8 = search_paths.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_1f4 = 0;
  for (ppVar7 = search_paths.
                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = search_paths.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish, ppVar7 != local_e8; ppVar7 = ppVar7 + 1)
  {
    bVar2 = std::filesystem::exists(ppVar7);
    if (bVar2) {
      std::filesystem::__cxx11::directory_iterator::directory_iterator
                ((directory_iterator *)&dir_it._M_dir,ppVar7,skip_permission_denied);
      std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f8,&dir_it._M_dir);
      local_128._M_dataplus._M_p = (pointer)local_f8._M_ptr;
      local_128._M_string_length = (size_type)local_f8._M_refcount._M_pi;
      local_f8._M_ptr = (element_type *)0x0;
      local_f8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
      std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_98,&dir_it._M_dir);
      __end2._M_dir._M_ptr = (element_type *)0x0;
      __end2._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
             __end2._M_dir._M_refcount._M_pi) {
        this = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                 ((directory_iterator *)&local_128);
        bVar2 = std::filesystem::__cxx11::directory_entry::is_regular_file((directory_entry *)this);
        if (bVar2) {
          std::filesystem::__cxx11::path::filename((path *)&base_path,this);
          std::filesystem::__cxx11::path::extension(&ext,this);
          std::__cxx11::string::string((string *)&path,(string *)&file_prefix);
          lVar5 = std::__cxx11::string::find((string *)&base_path,(ulong)&path);
          if (lVar5 == 0) {
            bVar2 = std::filesystem::__cxx11::operator==(&ext,&file_extension);
            std::__cxx11::string::~string((string *)&path);
            if (bVar2) {
              path.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)dl_load_library(this);
              if (path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                pcVar6 = (code *)dlsym(path.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start,"ggml_backend_score");
                if (pcVar6 != (code *)0x0) {
                  iVar3 = (*pcVar6)();
                  if (local_1f4 < iVar3) {
                    std::filesystem::__cxx11::path::operator=(&best_path,this);
                    local_1f4 = iVar3;
                  }
                }
              }
              std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr
                        ((unique_ptr<void,_dl_handle_deleter> *)&path);
            }
          }
          else {
            std::__cxx11::string::~string((string *)&path);
          }
          std::filesystem::__cxx11::path::~path(&ext);
          std::filesystem::__cxx11::path::~path((path *)&base_path);
        }
        std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_128);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end2._M_dir._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&dir_it._M_dir._M_refcount);
    }
    else {
      path_str(&base_path,ppVar7);
      ggml_log_internal(1,"%s: search path %s does not exist\n","ggml_backend_load_best",
                        base_path._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&base_path);
    }
  }
  if (local_1f4 == 0) {
    ppVar7 = search_paths.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppVar7 == ppVar1) break;
      backend_filename_prefix_abi_cxx11_();
      std::operator+(&local_128,&ext._M_pathname,&name_path._M_pathname);
      backend_filename_extension_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir_it,
                     &local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path);
      std::filesystem::__cxx11::path::path
                ((path *)&base_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir_it,
                 auto_format);
      std::__cxx11::string::~string((string *)&dir_it);
      std::filesystem::__cxx11::path::~path((path *)&path);
      std::__cxx11::string::~string((string *)&local_128);
      std::filesystem::__cxx11::path::~path(&ext);
      std::filesystem::__cxx11::operator/(&ext,ppVar7,(path *)&base_path);
      bVar2 = std::filesystem::exists(&ext);
      if (bVar2) {
        get_reg();
        ggml_backend_registry::load_backend(&get_reg::reg,&ext,true);
      }
      std::filesystem::__cxx11::path::~path(&ext);
      std::filesystem::__cxx11::path::~path((path *)&base_path);
      ppVar7 = ppVar7 + 1;
    } while (!bVar2);
  }
  else {
    get_reg();
    ggml_backend_registry::load_backend(&get_reg::reg,&best_path,true);
  }
  std::filesystem::__cxx11::path::~path(&best_path);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&search_paths);
  std::filesystem::__cxx11::path::~path(&file_extension);
  std::filesystem::__cxx11::path::~path(&file_prefix);
  std::filesystem::__cxx11::path::~path(&name_path);
  return extraout_RAX;
}

Assistant:

static ggml_backend_reg_t ggml_backend_load_best(const char * name, bool silent, const char * user_search_path) {
    // enumerate all the files that match [lib]ggml-name-*.[so|dll] in the search paths
    const fs::path name_path = fs::u8path(name);
    const fs::path file_prefix = backend_filename_prefix().native() + name_path.native() + fs::u8path("-").native();
    const fs::path file_extension = backend_filename_extension();

    std::vector<fs::path> search_paths;
    if (user_search_path == nullptr) {
        // default search paths: executable directory, current directory
        search_paths.push_back(get_executable_path());
        search_paths.push_back(fs::current_path());
    } else {
        search_paths.push_back(fs::u8path(user_search_path));
    }

    int best_score = 0;
    fs::path best_path;

    for (const auto & search_path : search_paths) {
        if (!fs::exists(search_path)) {
            GGML_LOG_DEBUG("%s: search path %s does not exist\n", __func__, path_str(search_path).c_str());
            continue;
        }
        fs::directory_iterator dir_it(search_path, fs::directory_options::skip_permission_denied);
        for (const auto & entry : dir_it) {
            if (entry.is_regular_file()) {
                auto filename = entry.path().filename();
                auto ext = entry.path().extension();
                if (filename.native().find(file_prefix) == 0 && ext == file_extension) {
                    dl_handle_ptr handle { dl_load_library(entry) };
                    if (!handle && !silent) {
                        GGML_LOG_ERROR("%s: failed to load %s\n", __func__, path_str(entry.path()).c_str());
                    }
                    if (handle) {
                        auto score_fn = (ggml_backend_score_t) dl_get_sym(handle.get(), "ggml_backend_score");
                        if (score_fn) {
                            int s = score_fn();
#ifndef NDEBUG
                            GGML_LOG_DEBUG("%s: %s score: %d\n", __func__, path_str(entry.path()).c_str(), s);
#endif
                            if (s > best_score) {
                                best_score = s;
                                best_path = entry.path();
                            }
                        } else {
                            if (!silent) {
                                GGML_LOG_INFO("%s: failed to find ggml_backend_score in %s\n", __func__, path_str(entry.path()).c_str());
                            }
                        }
                    }
                }
            }
        }
    }

    if (best_score == 0) {
        // try to load the base backend
        for (const auto & search_path : search_paths) {
            fs::path filename = backend_filename_prefix().native() + name_path.native() + backend_filename_extension().native();
            fs::path path = search_path / filename;
            if (fs::exists(path)) {
                return get_reg().load_backend(path, silent);
            }
        }
        return nullptr;
    }

    return get_reg().load_backend(best_path, silent);
}